

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

Gia_Man_t * Of_ManDeriveMapping(Of_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  Gia_Obj_t *pGVar3;
  int *pCut_00;
  bool bVar4;
  int local_48;
  int Flag;
  int Place;
  int *pCut;
  int local_30;
  int iVar;
  int k;
  int i;
  Vec_Bit_t *vPointed;
  Vec_Int_t *vPacking;
  Vec_Int_t *vMapping;
  Of_Man_t *p_local;
  
  vPointed = (Vec_Bit_t *)0x0;
  if ((p->pPars->fCutMin == 0) && (p->pGia->vMapping == (Vec_Int_t *)0x0)) {
    iVar1 = Gia_ManObjNum(p->pGia);
    p_00 = Vec_IntAlloc(iVar1 + (int)p->pPars->Edge + (int)p->pPars->Area * 2);
    iVar1 = Gia_ManObjNum(p->pGia);
    Vec_IntFill(p_00,iVar1,0);
    if (p->pPars->nFastEdges != 0) {
      vPointed = (Vec_Bit_t *)Vec_IntAlloc(1000);
      Vec_IntPush((Vec_Int_t *)vPointed,0);
    }
    iVar1 = Gia_ManObjNum(p->pGia);
    p_01 = Vec_BitStart(iVar1);
    iVar = 0;
    do {
      if (p->pGia->nObjs <= iVar) {
        iVar1 = Vec_IntCap(p_00);
        if (iVar1 != 0x10) {
          iVar1 = Vec_IntSize(p_00);
          iVar2 = Vec_IntCap(p_00);
          if (iVar1 != iVar2) {
            __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                          ,0x6e4,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
          }
        }
        p->pGia->vMapping = p_00;
        p->pGia->vPacking = (Vec_Int_t *)vPointed;
        Vec_BitFree(p_01);
        return p->pGia;
      }
      pGVar3 = Gia_ManObj(p->pGia,iVar);
      iVar1 = Gia_ObjIsAnd(pGVar3);
      if ((iVar1 != 0) && (iVar1 = Of_ObjRefNum(p,iVar), iVar1 != 0)) {
        pGVar3 = Gia_ManObj(p->pGia,iVar);
        iVar1 = Gia_ObjIsBuf(pGVar3);
        if (iVar1 != 0) {
          __assert_fail("!Gia_ObjIsBuf(Gia_ManObj(p->pGia,i))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                        ,0x6cf,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
        }
        pCut_00 = Of_ObjCutBestP(p,iVar);
        iVar1 = Vec_IntSize(p_00);
        Vec_IntWriteEntry(p_00,iVar,iVar1);
        iVar1 = Of_CutSize(pCut_00);
        Vec_IntPush(p_00,iVar1);
        local_30 = 0;
        while( true ) {
          iVar1 = Of_CutSize(pCut_00);
          bVar4 = false;
          if (local_30 < iVar1) {
            pCut._4_4_ = Of_CutVar(pCut_00,local_30);
            bVar4 = pCut._4_4_ != 0;
          }
          if (!bVar4) break;
          Vec_IntPush(p_00,pCut._4_4_);
          local_30 = local_30 + 1;
        }
        Vec_IntPush(p_00,iVar);
        if ((vPointed != (Vec_Bit_t *)0x0) && (iVar1 = Vec_BitEntry(p_01,iVar), iVar1 == 0)) {
          iVar1 = Vec_IntSize((Vec_Int_t *)vPointed);
          Vec_IntPush((Vec_Int_t *)vPointed,0);
          Vec_IntPush((Vec_Int_t *)vPointed,iVar);
          local_30 = 0;
          while( true ) {
            iVar2 = Of_CutSize(pCut_00);
            bVar4 = false;
            if (local_30 < iVar2) {
              pCut._4_4_ = Of_CutVar(pCut_00,local_30);
              bVar4 = false;
              if (pCut._4_4_ != 0) {
                local_48 = Of_CutFlag(pCut_00,local_30);
                bVar4 = true;
              }
            }
            if (!bVar4) break;
            if (local_48 != 0) {
              Vec_IntPush((Vec_Int_t *)vPointed,pCut._4_4_);
              Vec_BitWriteEntry(p_01,pCut._4_4_,1);
            }
            local_30 = local_30 + 1;
          }
          iVar2 = Vec_IntSize((Vec_Int_t *)vPointed);
          Vec_IntAddToEntry((Vec_Int_t *)vPointed,iVar1,(iVar2 - iVar1) + -1);
          Vec_IntAddToEntry((Vec_Int_t *)vPointed,0,1);
        }
      }
      iVar = iVar + 1;
    } while( true );
  }
  __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                ,0x6c2,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
}

Assistant:

Gia_Man_t * Of_ManDeriveMapping( Of_Man_t * p )
{
    Vec_Int_t * vMapping, * vPacking = NULL;
    Vec_Bit_t * vPointed; 
    int i, k, iVar, * pCut, Place, Flag;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    if ( p->pPars->nFastEdges )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    vPointed = Vec_BitStart( Gia_ManObjNum(p->pGia) );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Of_ObjRefNum(p, i) )
            continue;
        assert( !Gia_ObjIsBuf(Gia_ManObj(p->pGia,i)) );
        pCut = Of_ObjCutBestP( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Of_CutSize(pCut) );
        Of_CutForEachVar( pCut, iVar, k )
            Vec_IntPush( vMapping, iVar );
        Vec_IntPush( vMapping, i );
        if ( vPacking == NULL || Vec_BitEntry(vPointed, i) )
            continue;
        Place = Vec_IntSize( vPacking );
        Vec_IntPush( vPacking, 0 );
        Vec_IntPush( vPacking, i );
        Of_CutForEachVarFlag( pCut, iVar, Flag, k )
            if ( Flag )
            {
                Vec_IntPush( vPacking, iVar );
                Vec_BitWriteEntry( vPointed, iVar, 1 );
            }
        Vec_IntAddToEntry( vPacking, Place, Vec_IntSize(vPacking)-Place-1 );
        Vec_IntAddToEntry( vPacking, 0, 1 );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    p->pGia->vPacking = vPacking;
    Vec_BitFree( vPointed );
    return p->pGia;
}